

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall Catch::clara::TextFlow::Column::iterator::operator*[abi_cxx11_(iterator *this)

{
  ulong uVar1;
  size_type sVar2;
  string *psVar3;
  string *in_RSI;
  iterator *in_RDI;
  long in_FS_OFFSET;
  string *plain;
  iterator *this_00;
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = in_RSI->_M_string_length;
  plain = in_RSI;
  this_00 = in_RDI;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(*(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   **)in_RSI);
  if (sVar2 <= uVar1) {
    __assert_fail("m_stringIndex < m_column.m_strings.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp"
                  ,0x2186,"std::string Catch::clara::TextFlow::Column::iterator::operator*() const")
    ;
  }
  if ((in_RSI->field_2)._M_allocated_capacity <= *(ulong *)(in_RSI + 1)) {
    psVar3 = line_abi_cxx11_((iterator *)0x28813c);
    ::std::__cxx11::string::substr((ulong)local_28,(ulong)psVar3);
    addIndentAndSuffix(this_00,plain);
    ::std::__cxx11::string::~string(local_28);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return (string *)in_RDI;
    }
    __stack_chk_fail();
  }
  __assert_fail("m_pos <= m_end",
                "/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp"
                ,0x2187,"std::string Catch::clara::TextFlow::Column::iterator::operator*() const");
}

Assistant:

auto operator *() const -> std::string {
			assert(m_stringIndex < m_column.m_strings.size());
			assert(m_pos <= m_end);
			return addIndentAndSuffix(line().substr(m_pos, m_len));
		}